

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::csharp::IsNullable(FieldDescriptor *descriptor)

{
  bool bVar1;
  Type TVar2;
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  FieldDescriptor *local_18;
  FieldDescriptor *descriptor_local;
  
  local_18 = descriptor;
  bVar1 = FieldDescriptor::is_repeated(descriptor);
  if (bVar1) {
    return true;
  }
  TVar2 = FieldDescriptor::type(local_18);
  if (7 < TVar2 - TYPE_DOUBLE) {
    if (TVar2 - TYPE_STRING < 4) {
      return true;
    }
    if (5 < TVar2 - TYPE_UINT32) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_helpers.cc"
                 ,0x248);
      other = internal::LogMessage::operator<<(&local_50,"Unknown field type.");
      internal::LogFinisher::operator=(local_5d,other);
      internal::LogMessage::~LogMessage(&local_50);
      return true;
    }
  }
  return false;
}

Assistant:

bool IsNullable(const FieldDescriptor* descriptor) {
  if (descriptor->is_repeated()) {
    return true;
  }

  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_BOOL:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
      return false;

    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES:
      return true;

    default:
      GOOGLE_LOG(FATAL) << "Unknown field type.";
      return true;
  }
}